

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong *puVar1;
  long *plVar2;
  int iVar3;
  char *s1;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  __m128i *palVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  parasail_result_t *result_00;
  __m128i *b;
  __m128i *palVar13;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  longlong lVar14;
  ulong uVar15;
  __m128i *palVar16;
  long lVar17;
  long lVar18;
  longlong lVar19;
  int iVar20;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong uVar21;
  ulong uVar22;
  parasail_result_t *ppVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  parasail_result_t *ppVar27;
  __m128i *palVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  __m128i *ptr;
  uint uVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  __m128i *palVar40;
  __m128i *ptr_00;
  __m128i *palVar41;
  __m128i *ptr_01;
  __m128i *palVar42;
  __m128i *ptr_02;
  bool bVar43;
  ulong uVar44;
  long lVar45;
  longlong lVar47;
  long lVar48;
  undefined1 auVar46 [16];
  __m128i_64_t B_4;
  long lVar52;
  longlong lVar53;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  long lVar54;
  long lVar55;
  long lVar57;
  long lVar58;
  undefined1 auVar56 [16];
  long lVar59;
  __m128i_64_t B_8;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  __m128i_64_t B;
  long lVar63;
  ulong uVar64;
  __m128i_64_t B_3;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  __m128i_64_t B_1;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  __m128i_64_t B_2;
  ulong uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  ulong uVar77;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i_64_t B_9;
  int local_204;
  long local_200;
  __m128i *local_1f8;
  __m128i *local_1f0;
  __m128i *local_1e8;
  __m128i *local_1e0;
  __m128i *local_1d8;
  __m128i *local_1d0;
  __m128i *local_1c8;
  __m128i *local_1c0;
  __m128i *local_1b8;
  ulong uStack_1b0;
  __m128i *local_1a0;
  __m128i *local_198;
  __m128i *local_170;
  __m128i *local_128;
  undefined1 local_78 [16];
  ulong uStack_60;
  ulong uStack_50;
  
  s1 = profile->s1;
  ppVar4 = profile->matrix;
  result = parasail_sw_striped_profile_sse2_128_64(profile,s2,s2Len,open,gap);
  iVar10 = parasail_result_is_saturated(result);
  if (iVar10 != 0) {
    return result;
  }
  iVar10 = result->end_query;
  iVar3 = result->end_ref;
  profile_00 = parasail_profile_create_stats_sse_128_64(s1,iVar10 + 1,ppVar4);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar5 = (profile_00->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_stats_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar4 = profile_00->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar36 = profile_00->s1Len;
        uVar15 = (ulong)uVar36;
        if ((int)uVar36 < 1) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_4();
        }
        else if (iVar3 < 0) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_sse2_128_64_cold_2();
        }
        else {
          if (-1 < gap) {
            pvVar6 = (profile_00->profile64).matches;
            pvVar7 = (profile_00->profile64).similar;
            iVar12 = ppVar4->max;
            result_00 = parasail_result_new_stats();
            ppVar27 = (parasail_result_t *)0x0;
            if (result_00 == (parasail_result_t *)0x0) goto LAB_00595ee5;
            uVar22 = uVar15 + 1 >> 1;
            result_00->flag = result_00->flag | 0x2810804;
            b = parasail_memalign___m128i(0x10,uVar22);
            local_128 = parasail_memalign___m128i(0x10,uVar22);
            palVar13 = parasail_memalign___m128i(0x10,uVar22);
            local_1c8 = parasail_memalign___m128i(0x10,uVar22);
            b_00 = parasail_memalign___m128i(0x10,uVar22);
            local_170 = parasail_memalign___m128i(0x10,uVar22);
            b_01 = parasail_memalign___m128i(0x10,uVar22);
            local_1d0 = parasail_memalign___m128i(0x10,uVar22);
            b_02 = parasail_memalign___m128i(0x10,uVar22);
            b_03 = parasail_memalign___m128i(0x10,uVar22);
            b_04 = parasail_memalign___m128i(0x10,uVar22);
            b_05 = parasail_memalign___m128i(0x10,uVar22);
            local_1f0 = parasail_memalign___m128i(0x10,uVar22);
            local_1d8 = parasail_memalign___m128i(0x10,uVar22);
            local_1f8 = parasail_memalign___m128i(0x10,uVar22);
            local_1c0 = parasail_memalign___m128i(0x10,uVar22);
            ppVar23 = (parasail_result_t *)0x0;
            ppVar27 = (parasail_result_t *)0x0;
            if ((((((b == (__m128i *)0x0) || (local_128 == (__m128i *)0x0)) ||
                  (ppVar27 = ppVar23, palVar13 == (__m128i *)0x0)) ||
                 ((local_1c8 == (__m128i *)0x0 || (b_00 == (__m128i *)0x0)))) ||
                (((local_170 == (__m128i *)0x0 ||
                  ((b_01 == (__m128i *)0x0 || (local_1d0 == (__m128i *)0x0)))) ||
                 (b_02 == (__m128i *)0x0)))) ||
               ((((b_03 == (__m128i *)0x0 || (b_04 == (__m128i *)0x0)) || (b_05 == (__m128i *)0x0))
                || (((local_1f0 == (__m128i *)0x0 || (local_1d8 == (__m128i *)0x0)) ||
                    ((local_1f8 == (__m128i *)0x0 || (local_1c0 == (__m128i *)0x0))))))))
            goto LAB_00595ee5;
            uVar44 = (ulong)(uint)gap;
            local_1b8 = (__m128i *)0x0;
            uStack_1b0 = 0;
            c[1] = (longlong)b_03;
            c[0] = uVar22;
            palVar16 = b_02;
            parasail_memset___m128i(b,c,(size_t)b_02);
            c_00[1] = extraout_RDX;
            c_00[0] = uVar22;
            parasail_memset___m128i(palVar13,c_00,(size_t)palVar16);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar22;
            parasail_memset___m128i(b_00,c_01,(size_t)palVar16);
            c_02[1] = extraout_RDX_01;
            c_02[0] = uVar22;
            parasail_memset___m128i(b_01,c_02,(size_t)palVar16);
            c_03[1] = extraout_RDX_02;
            c_03[0] = uVar22;
            parasail_memset___m128i(b_02,c_03,(size_t)palVar16);
            c_04[1] = extraout_RDX_03;
            c_04[0] = uVar22;
            parasail_memset___m128i(b_03,c_04,(size_t)palVar16);
            c_05[1] = extraout_RDX_04;
            c_05[0] = uVar22;
            parasail_memset___m128i(b_04,c_05,(size_t)palVar16);
            c_06[1] = extraout_RDX_05;
            c_06[0] = uVar22;
            parasail_memset___m128i(b_05,c_06,(size_t)palVar16);
            uVar8 = (uint)uVar22;
            uVar11 = uVar8 - 1;
            uVar26 = 0;
            local_204 = 0;
            local_200 = -0x4000000000000000;
            local_78 = (undefined1  [16])0x0;
            lVar48 = 0;
            lVar18 = 0;
            do {
              local_1e0 = b_01;
              palVar42 = b;
              palVar41 = b_00;
              palVar40 = palVar13;
              lVar37 = (long)(int)(ppVar4->mapper[(byte)s2[uVar26]] * uVar8) * 0x10;
              iVar33 = (int)uVar26 + -2;
              b_00 = local_170;
              palVar16 = local_1d8;
              palVar13 = local_1c0;
              b_01 = local_1d0;
              if (local_204 == iVar33) {
                b_00 = local_1f8;
                palVar16 = local_1c8;
                palVar13 = local_1d0;
                b_01 = local_1c0;
              }
              local_1c0 = palVar13;
              b = local_128;
              palVar13 = local_1c8;
              if (local_204 == iVar33) {
                b = local_1f0;
                palVar13 = local_1d8;
              }
              local_1d0 = local_1e0;
              lVar53 = local_1e0[uVar11][0];
              lVar63 = 0;
              lVar19 = palVar41[uVar11][0];
              lVar59 = 0;
              lVar14 = palVar40[uVar11][0];
              lVar55 = 0;
              lVar47 = palVar42[uVar11][0];
              lVar45 = 0;
              lVar17 = 0;
              uVar64 = 1;
              uVar62 = 1;
              uVar35 = 0;
              uVar61 = 0;
              uVar77 = 0;
              uVar66 = 0;
              lVar32 = 0;
              lVar60 = 0;
              lVar38 = lVar48;
              lVar58 = lVar18;
              do {
                plVar2 = (long *)((long)pvVar5 + lVar17 + lVar37);
                lVar45 = lVar45 + *plVar2;
                lVar48 = lVar47 + plVar2[1];
                if (lVar45 < 1) {
                  lVar45 = 0;
                }
                if (lVar48 < 1) {
                  lVar48 = 0;
                }
                lVar18 = *(long *)((long)*b_02 + lVar17);
                lVar52 = *(long *)((long)*b_02 + lVar17 + 8);
                if (lVar18 < lVar45) {
                  lVar18 = lVar45;
                }
                if (lVar52 < lVar48) {
                  lVar52 = lVar48;
                }
                lVar54 = lVar32;
                if (lVar32 < lVar18) {
                  lVar54 = lVar18;
                }
                lVar57 = lVar60;
                if (lVar60 < lVar52) {
                  lVar57 = lVar52;
                }
                uVar25 = -(ulong)(lVar54 == 0);
                uVar65 = -(ulong)(lVar57 == 0);
                uVar39 = -(ulong)(lVar54 == lVar45);
                uVar29 = -(ulong)(lVar57 == lVar48);
                uVar24 = -(ulong)(lVar18 <= lVar32);
                puVar1 = (ulong *)((long)*b_03 + lVar17);
                uVar72 = *puVar1;
                uVar34 = puVar1[1];
                uVar31 = -(ulong)(lVar52 <= lVar60);
                plVar2 = (long *)((long)*b_02 + lVar17);
                lVar45 = *plVar2;
                lVar52 = plVar2[1];
                puVar1 = (ulong *)((long)*b_04 + lVar17);
                uVar68 = *puVar1;
                uVar70 = puVar1[1];
                puVar1 = (ulong *)((long)*b_05 + lVar17);
                uVar21 = *puVar1;
                uVar67 = puVar1[1];
                plVar2 = (long *)((long)*b + lVar17);
                *plVar2 = lVar54;
                plVar2[1] = lVar57;
                plVar2 = (long *)((long)pvVar6 + lVar17 + lVar37);
                uVar69 = ~uVar25 & (lVar55 + *plVar2 & uVar39 |
                                   ~uVar39 & (uVar24 & uVar77 | ~uVar24 & uVar72));
                uVar71 = ~uVar65 & (lVar14 + plVar2[1] & uVar29 |
                                   ~uVar29 & (uVar31 & uVar66 | ~uVar31 & uVar34));
                puVar1 = (ulong *)((long)*palVar13 + lVar17);
                *puVar1 = uVar69;
                puVar1[1] = uVar71;
                plVar2 = (long *)((long)pvVar7 + lVar17 + lVar37);
                uVar73 = ~uVar25 & (lVar59 + *plVar2 & uVar39 |
                                   ~uVar39 & (uVar24 & uVar35 | ~uVar24 & uVar68));
                uVar74 = ~uVar65 & (lVar19 + plVar2[1] & uVar29 |
                                   ~uVar29 & (uVar31 & uVar61 | ~uVar31 & uVar70));
                auVar75._8_4_ = 0xffffffff;
                auVar75._0_8_ = 0xffffffffffffffff;
                auVar75._12_4_ = 0xffffffff;
                lVar55 = auVar75._8_8_;
                puVar1 = (ulong *)((long)*b_00 + lVar17);
                *puVar1 = uVar73;
                puVar1[1] = uVar74;
                uVar25 = ~uVar25 & (lVar63 + 1U & uVar39 |
                                   ~uVar39 & (uVar24 & uVar64 | ~uVar24 & uVar21));
                uVar65 = ~uVar65 & (lVar53 - lVar55 & uVar29 |
                                   ~uVar29 & (uVar31 & uVar62 | ~uVar31 & uVar67));
                puVar1 = (ulong *)((long)*b_01 + lVar17);
                *puVar1 = uVar25;
                puVar1[1] = uVar65;
                palVar28 = (__m128i *)uVar69;
                if ((long)uVar69 < (long)local_1b8) {
                  palVar28 = local_1b8;
                }
                uVar24 = uVar71;
                if ((long)uVar71 < (long)uStack_1b0) {
                  uVar24 = uStack_1b0;
                }
                if ((long)palVar28 <= (long)uVar73) {
                  palVar28 = (__m128i *)uVar73;
                }
                if ((long)uVar24 <= (long)uVar74) {
                  uVar24 = uVar74;
                }
                local_1b8 = palVar28;
                if ((long)palVar28 <= (long)uVar25) {
                  local_1b8 = (__m128i *)uVar25;
                }
                uStack_1b0 = uVar24;
                if ((long)uVar24 <= (long)uVar65) {
                  uStack_1b0 = uVar65;
                }
                lVar48 = lVar54;
                if (lVar54 <= lVar38) {
                  lVar48 = lVar38;
                }
                lVar18 = lVar57;
                if (lVar57 <= lVar58) {
                  lVar18 = lVar58;
                }
                uStack_50 = (ulong)(uint)open;
                lVar54 = lVar54 - (ulong)(uint)open;
                lVar57 = lVar57 - uStack_50;
                uStack_60 = (ulong)(uint)gap;
                lVar45 = lVar45 - uVar44;
                lVar52 = lVar52 - uStack_60;
                lVar63 = lVar45;
                if (lVar45 < lVar54) {
                  lVar63 = lVar54;
                }
                uVar24 = -(ulong)(lVar45 < lVar54);
                lVar45 = lVar52;
                if (lVar52 < lVar57) {
                  lVar45 = lVar57;
                }
                uVar29 = -(ulong)(lVar52 < lVar57);
                plVar2 = (long *)((long)*b_02 + lVar17);
                *plVar2 = lVar63;
                plVar2[1] = lVar45;
                lVar45 = lVar32 - uVar44;
                lVar63 = lVar60 - uStack_60;
                lVar32 = lVar45;
                if (lVar45 < lVar54) {
                  lVar32 = lVar54;
                }
                uVar31 = -(ulong)(lVar45 < lVar54);
                lVar60 = lVar63;
                if (lVar63 < lVar57) {
                  lVar60 = lVar57;
                }
                puVar1 = (ulong *)((long)*b_03 + lVar17);
                *puVar1 = uVar24 & uVar69 | ~uVar24 & uVar72;
                puVar1[1] = uVar29 & uVar71 | ~uVar29 & uVar34;
                puVar1 = (ulong *)((long)*b_04 + lVar17);
                *puVar1 = uVar24 & uVar73 | ~uVar24 & uVar68;
                puVar1[1] = uVar29 & uVar74 | ~uVar29 & uVar70;
                puVar1 = (ulong *)((long)*b_05 + lVar17);
                *puVar1 = ~uVar24 & uVar21 + 1 | uVar25 + 1 & uVar24;
                puVar1[1] = ~uVar29 & uVar67 - lVar55 | uVar65 - lVar55 & uVar29;
                uVar21 = -(ulong)(lVar63 < lVar57);
                uVar77 = uVar69 & uVar31 | ~uVar31 & uVar77;
                uVar66 = uVar71 & uVar21 | ~uVar21 & uVar66;
                uVar35 = uVar73 & uVar31 | ~uVar31 & uVar35;
                uVar61 = uVar74 & uVar21 | ~uVar21 & uVar61;
                uVar64 = ~uVar31 & uVar64 + 1 | uVar25 + 1 & uVar31;
                uVar62 = ~uVar21 & uVar62 - lVar55 | uVar65 - lVar55 & uVar21;
                plVar2 = (long *)((long)*palVar42 + lVar17);
                lVar45 = *plVar2;
                lVar47 = plVar2[1];
                plVar2 = (long *)((long)*palVar40 + lVar17);
                lVar55 = *plVar2;
                lVar14 = plVar2[1];
                plVar2 = (long *)((long)*palVar41 + lVar17);
                lVar59 = *plVar2;
                lVar19 = plVar2[1];
                plVar2 = (long *)((long)*local_1e0 + lVar17);
                lVar63 = *plVar2;
                lVar53 = plVar2[1];
                lVar17 = lVar17 + 0x10;
                lVar38 = lVar48;
                lVar58 = lVar18;
              } while (uVar22 << 4 != lVar17);
              if (local_204 == iVar33) {
                local_1f0 = local_128;
                local_1f8 = local_170;
              }
              auVar76._8_4_ = 0xffffffff;
              auVar76._0_8_ = 0xffffffffffffffff;
              auVar76._12_4_ = 0xffffffff;
              iVar33 = 0;
              do {
                lVar53 = palVar42[uVar11][0];
                lVar45 = 0;
                lVar38 = 0;
                lVar55 = (long)-open;
                lVar63 = lVar32;
                lVar59 = lVar48;
                lVar60 = lVar18;
                uVar35 = 0;
                uVar61 = uVar35;
                uVar77 = 0;
                uVar62 = uVar77;
                uVar64 = 1;
                uVar66 = uVar64;
                do {
                  lVar32 = lVar55;
                  plVar2 = (long *)((long)pvVar5 + lVar38 + lVar37);
                  lVar45 = lVar45 + *plVar2;
                  lVar53 = lVar53 + plVar2[1];
                  if (lVar45 < 1) {
                    lVar45 = 0;
                  }
                  if (lVar53 < 1) {
                    lVar53 = 0;
                  }
                  lVar48 = *(long *)((long)*b + lVar38);
                  lVar18 = *(long *)((long)*b + lVar38 + 8);
                  lVar55 = lVar32;
                  if (lVar32 < lVar48) {
                    lVar55 = lVar48;
                  }
                  lVar58 = lVar63;
                  if (lVar63 < lVar18) {
                    lVar58 = lVar18;
                  }
                  plVar2 = (long *)((long)*b + lVar38);
                  *plVar2 = lVar55;
                  plVar2[1] = lVar58;
                  uVar25 = ~-(ulong)(lVar55 == lVar45) & -(ulong)(lVar48 <= lVar32);
                  uVar21 = ~-(ulong)(lVar58 == lVar53) & -(ulong)(lVar18 <= lVar63);
                  puVar1 = (ulong *)((long)*palVar13 + lVar38);
                  uVar67 = uVar25 & uVar77 | ~uVar25 & *puVar1;
                  uVar68 = uVar21 & uVar62 | ~uVar21 & puVar1[1];
                  puVar1 = (ulong *)((long)*palVar13 + lVar38);
                  *puVar1 = uVar67;
                  puVar1[1] = uVar68;
                  puVar1 = (ulong *)((long)*b_00 + lVar38);
                  uVar70 = uVar25 & uVar35 | ~uVar25 & *puVar1;
                  uVar72 = uVar21 & uVar61 | ~uVar21 & puVar1[1];
                  puVar1 = (ulong *)((long)*b_00 + lVar38);
                  *puVar1 = uVar70;
                  puVar1[1] = uVar72;
                  puVar1 = (ulong *)((long)*b_01 + lVar38);
                  uVar65 = uVar25 & uVar64 | ~uVar25 & *puVar1;
                  uVar21 = uVar21 & uVar66 | ~uVar21 & puVar1[1];
                  uVar25 = uVar67;
                  if ((long)uVar67 < (long)local_1b8) {
                    uVar25 = (ulong)local_1b8;
                  }
                  uVar34 = uVar68;
                  if ((long)uVar68 < (long)uStack_1b0) {
                    uVar34 = uStack_1b0;
                  }
                  if ((long)uVar25 <= (long)uVar70) {
                    uVar25 = uVar70;
                  }
                  if ((long)uVar34 <= (long)uVar72) {
                    uVar34 = uVar72;
                  }
                  local_1b8 = (__m128i *)uVar25;
                  if ((long)uVar25 <= (long)uVar65) {
                    local_1b8 = (__m128i *)uVar65;
                  }
                  uStack_1b0 = uVar34;
                  if ((long)uVar34 <= (long)uVar21) {
                    uStack_1b0 = uVar21;
                  }
                  lVar48 = lVar55;
                  if (lVar55 <= lVar59) {
                    lVar48 = lVar59;
                  }
                  lVar18 = lVar58;
                  if (lVar58 <= lVar60) {
                    lVar18 = lVar60;
                  }
                  lVar55 = lVar55 - (ulong)(uint)open;
                  lVar58 = lVar58 - uStack_50;
                  lVar59 = lVar32 - uVar44;
                  lVar60 = lVar63 - uStack_60;
                  puVar1 = (ulong *)((long)*b_01 + lVar38);
                  *puVar1 = uVar65;
                  puVar1[1] = uVar21;
                  auVar50._8_8_ = -(ulong)(lVar60 != lVar58 && lVar58 <= lVar60);
                  auVar50._0_8_ = -(ulong)(lVar59 != lVar55 && lVar55 <= lVar59);
                  auVar56._8_8_ = -(ulong)(lVar60 == lVar58);
                  auVar56._0_8_ = -(ulong)(lVar59 == lVar55);
                  auVar49._8_8_ = -(ulong)(0 < lVar60);
                  auVar49._0_8_ = -(ulong)(0 < lVar59);
                  auVar50 = auVar49 & auVar56 | auVar50;
                  if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar50 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar50 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar50 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar50 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar50 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar50 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar50 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar50 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar50 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar50 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar50 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar50[0xf]) {
                    iVar20 = 0x1e;
                  }
                  else {
                    uVar25 = -(ulong)(lVar59 < lVar55);
                    uVar34 = -(ulong)(lVar60 < lVar58);
                    uVar77 = uVar67 & uVar25 | ~uVar25 & uVar77;
                    uVar62 = uVar68 & uVar34 | ~uVar34 & uVar62;
                    uVar35 = uVar70 & uVar25 | ~uVar25 & uVar35;
                    uVar61 = uVar72 & uVar34 | ~uVar34 & uVar61;
                    uVar64 = uVar65 + 1 & uVar25 | ~uVar25 & uVar64 + 1;
                    uVar66 = uVar21 - auVar76._8_8_ & uVar34 | ~uVar34 & uVar66 - auVar76._8_8_;
                    plVar2 = (long *)((long)*palVar42 + lVar38);
                    lVar45 = *plVar2;
                    lVar53 = plVar2[1];
                    iVar20 = 0;
                    lVar32 = lVar59;
                    lVar63 = lVar60;
                  }
                  if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar50 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar50 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar50 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar50 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar50 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar50 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar50 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar50 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar50 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar50 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar50 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar50[0xf]) goto LAB_00595b0d;
                  lVar38 = lVar38 + 0x10;
                  lVar55 = lVar32;
                  lVar59 = lVar48;
                  lVar60 = lVar18;
                } while (uVar22 << 4 != lVar38);
                iVar20 = 0;
LAB_00595b0d:
                if (iVar20 != 0) {
                  if (iVar20 != 0x1e) {
                    bVar43 = false;
                    goto LAB_00595bd3;
                  }
                  break;
                }
                bVar43 = iVar33 == 0;
                iVar33 = iVar33 + 1;
              } while (bVar43);
              uVar35 = -(ulong)((long)local_78._8_8_ < lVar18);
              auVar46._8_8_ = uVar35;
              auVar46._0_8_ = -(ulong)((long)local_78._0_8_ < lVar48);
              bVar43 = true;
              if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar46 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (uVar35 >> 7 & 1) != 0) || (uVar35 >> 0xf & 1) != 0) ||
                      (uVar35 >> 0x17 & 1) != 0) || (uVar35 >> 0x1f & 1) != 0) ||
                    (uVar35 >> 0x27 & 1) != 0) || (uVar35 >> 0x2f & 1) != 0) ||
                  (uVar35 >> 0x37 & 1) != 0) || (long)local_78._8_8_ < lVar18) {
                local_200 = lVar18;
                if (lVar18 < lVar48) {
                  local_200 = lVar48;
                }
                if ((long)(~(long)iVar12 + 0x7fffffffffffffffU) < local_200) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                  bVar43 = false;
                }
                else {
                  local_78._8_4_ = (int)local_200;
                  local_78._0_8_ = local_200;
                  local_78._12_4_ = (int)((ulong)local_200 >> 0x20);
                  local_204 = (int)uVar26;
                }
              }
LAB_00595bd3:
              local_1c8 = palVar40;
              if (!bVar43) goto LAB_00595c09;
              uVar26 = uVar26 + 1;
              local_1d8 = palVar16;
              local_170 = palVar41;
              local_128 = palVar42;
            } while (uVar26 != iVar3 + 1U);
            uVar26 = (ulong)(iVar3 + 1U);
LAB_00595c09:
            if (local_200 == 0x7fffffffffffffff) {
LAB_00595c56:
              *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
            }
            else {
              uVar22 = -(ulong)(uStack_1b0 == 0x7fffffffffffffff);
              auVar51._8_8_ = uVar22;
              auVar51._0_8_ = -(ulong)(local_1b8 == (__m128i *)0x7fffffffffffffff);
              if ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar51 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar51 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar51 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar51 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar51 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (uVar22 >> 7 & 1) != 0) || (uVar22 >> 0xf & 1) != 0) ||
                      (uVar22 >> 0x17 & 1) != 0) || (uVar22 >> 0x1f & 1) != 0) ||
                    (uVar22 >> 0x27 & 1) != 0) || (uVar22 >> 0x2f & 1) != 0) ||
                  (uVar22 >> 0x37 & 1) != 0) || uStack_1b0 == 0x7fffffffffffffff) goto LAB_00595c56;
            }
            iVar12 = parasail_result_is_saturated(result_00);
            iVar33 = 0;
            local_1a0 = palVar41;
            local_1e8 = palVar42;
            if (iVar12 == 0) {
              palVar28 = b_00;
              ptr = b_01;
              ptr_00 = palVar16;
              ptr_01 = local_1f8;
              ptr_02 = local_1f0;
              local_198 = b;
              palVar9 = local_1c0;
              local_1b8 = palVar13;
              if ((local_204 != (int)uVar26 + -1) &&
                 (palVar28 = local_1f8, ptr = local_1c0, ptr_00 = palVar13, ptr_01 = b_00,
                 ptr_02 = b, local_198 = local_1f0, palVar9 = b_01, local_1b8 = palVar16,
                 local_204 == (int)uVar26 + -2)) {
                local_1a0 = local_1f8;
                local_1e8 = local_1f0;
                palVar28 = palVar41;
                ptr = local_1e0;
                local_198 = palVar42;
                local_1d0 = local_1c0;
                local_1c8 = palVar16;
                local_1b8 = palVar40;
              }
              local_1e0 = palVar9;
              lVar53 = 0;
              if ((uVar15 + 1 & 0x7ffffffe) == 0) {
                iVar33 = 0;
                iVar12 = 0;
                iVar20 = 0;
              }
              else {
                uVar22 = 0;
                lVar14 = 0;
                lVar19 = 0;
                do {
                  if ((*local_198)[uVar22] == local_200) {
                    uVar36 = 0;
                    if ((uVar22 & 1) != 0) {
                      uVar36 = uVar8;
                    }
                    uVar36 = uVar36 + ((uint)(uVar22 >> 1) & 0x7fffffff);
                    if ((int)uVar36 < (int)uVar15) {
                      lVar53 = (*local_1b8)[uVar22];
                      lVar19 = (*palVar28)[uVar22];
                      lVar14 = (*ptr)[uVar22];
                      uVar15 = (ulong)uVar36;
                    }
                  }
                  iVar12 = (int)lVar14;
                  iVar33 = (int)lVar19;
                  iVar20 = (int)lVar53;
                  uVar36 = (uint)uVar15;
                  uVar22 = uVar22 + 1;
                } while ((uVar8 & 0x3fffffff) * 2 != (int)uVar22);
              }
              iVar30 = (int)local_200;
            }
            else {
              iVar12 = 0;
              iVar20 = 0;
              iVar30 = 0;
              local_204 = 0;
              uVar36 = 0;
              local_1b8 = palVar16;
              ptr = local_1c0;
              ptr_00 = palVar13;
              ptr_01 = b_00;
              ptr_02 = b;
              palVar28 = local_1f8;
              local_1e0 = b_01;
              local_198 = local_1f0;
            }
            result_00->score = iVar30;
            result_00->end_query = uVar36;
            result_00->end_ref = local_204;
            ((result_00->field_4).stats)->matches = iVar20;
            ((result_00->field_4).stats)->similar = iVar33;
            ((result_00->field_4).stats)->length = iVar12;
            parasail_free(ptr);
            parasail_free(palVar28);
            parasail_free(local_1b8);
            parasail_free(local_198);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(local_1d0);
            parasail_free(local_1e0);
            parasail_free(local_1a0);
            parasail_free(ptr_01);
            parasail_free(local_1c8);
            parasail_free(ptr_00);
            parasail_free(local_1e8);
            parasail_free(ptr_02);
            ppVar27 = result_00;
            goto LAB_00595ee5;
          }
          parasail_sw_stats_striped_profile_sse2_128_64_cold_1();
        }
      }
    }
  }
  ppVar27 = (parasail_result_t *)0x0;
LAB_00595ee5:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  ppVar27->end_query = iVar10;
  ppVar27->end_ref = iVar3;
  return ppVar27;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_sse2_128_64(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_sse_128_64(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_sse2_128_64(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_sse_128_64(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_sse_128_64(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}